

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandClockGate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pCare;
  int *piVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Cgt_Par_t Pars;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Cgt_SetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
LAB_00239447:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"LNDCVKavwh");
    iVar4 = globalUtilOptind;
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_002395ef:
        Abc_Print(-1,pcVar5);
        goto switchD_00239463_caseD_45;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nConfMax = iVar1;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-D\" should be followed by an integer.\n";
        goto LAB_002395ef;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nOdcMax = iVar1;
      break;
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4d:
      goto switchD_00239463_caseD_45;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
        goto LAB_002395ef;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nFlopsMin = iVar1;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_002395ef;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nLevelMax = iVar1;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_002395ef;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nCandMax = iVar1;
      break;
    default:
      if (iVar1 != 0x56) {
        piVar3 = &Pars.fAreaOnly;
        if ((iVar1 != 0x61) && (piVar3 = &Pars.fVerbose, iVar1 != 0x76)) {
          if (iVar1 != 0x77) {
            if (iVar1 == -1) {
              if (pAVar2 != (Abc_Ntk_t *)0x0) {
                if (globalUtilOptind + 1 == argc) {
                  pcVar5 = argv[globalUtilOptind];
                  FileType = Io_ReadFileType(pcVar5);
                  iVar4 = 1;
                  pCare = Io_Read(pcVar5,FileType,1,0);
                  if (pCare == (Abc_Ntk_t *)0x0) {
                    pcVar5 = "Reading care network has failed.\n";
                    goto LAB_0023977d;
                  }
                  pAVar2 = Abc_NtkDarClockGate(pAVar2,pCare,&Pars);
                  Abc_NtkDelete(pCare);
LAB_0023974c:
                  if (pAVar2 != (Abc_Ntk_t *)0x0) {
                    Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
                    return 0;
                  }
                  pcVar5 = "Clock gating has failed.\n";
                }
                else {
                  if (globalUtilOptind == argc) {
                    pAVar2 = Abc_NtkDarClockGate(pAVar2,(Abc_Ntk_t *)0x0,&Pars);
                    goto LAB_0023974c;
                  }
                  pcVar5 = "Wrong number of arguments.\n";
                }
                iVar4 = 0;
LAB_0023977d:
                Abc_Print(-1,pcVar5);
                return iVar4;
              }
              pcVar5 = "Empty network.\n";
              iVar4 = -1;
              goto LAB_0023970f;
            }
            goto switchD_00239463_caseD_45;
          }
          piVar3 = &Pars.fVeryVerbose;
        }
        *(byte *)piVar3 = (byte)*piVar3 ^ 1;
        goto LAB_00239447;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-V\" should be followed by an integer.\n";
        goto LAB_002395ef;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nVarsMin = iVar1;
    }
    globalUtilOptind = iVar4 + 1;
    if (iVar1 < 1) {
switchD_00239463_caseD_45:
      iVar4 = -2;
      Abc_Print(-2,"usage: clockgate [-LNDCVK <num>] [-avwh] <file>\n");
      Abc_Print(-2,"\t         sequential clock gating with observability don\'t-cares\n");
      Abc_Print(-2,"\t-L num : max level number of a clock gate [default = %d]\n",
                (ulong)(uint)Pars.nLevelMax);
      Abc_Print(-2,"\t-N num : max number of candidates for a flop [default = %d]\n",
                (ulong)(uint)Pars.nCandMax);
      Abc_Print(-2,"\t-D num : max number of ODC levels to consider [default = %d]\n",
                (ulong)(uint)Pars.nOdcMax);
      Abc_Print(-2,"\t-C num : max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nConfMax);
      Abc_Print(-2,"\t-V num : min number of vars to recycle SAT solver [default = %d]\n",
                (ulong)(uint)Pars.nVarsMin);
      Abc_Print(-2,"\t-K num : min number of flops to recycle SAT solver [default = %d]\n",
                (ulong)(uint)Pars.nFlopsMin);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (Pars.fAreaOnly == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle minimizing area-only [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      if (Pars.fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle even more detailed output [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar5 = "\tfile   : (optional) constraints for primary inputs and register outputs\n";
LAB_0023970f:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandClockGate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cgt_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk, * pNtkCare;
    int c;

    extern Abc_Ntk_t * Abc_NtkDarClockGate( Abc_Ntk_t * pNtk, Abc_Ntk_t * pCare, Cgt_Par_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Cgt_SetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LNDCVKavwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLevelMax <= 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCandMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCandMax <= 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOdcMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOdcMax <= 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfMax <= 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVarsMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVarsMin <= 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFlopsMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFlopsMin <= 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNtkCare = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
        if ( pNtkCare == NULL )
        {
            Abc_Print( -1, "Reading care network has failed.\n" );
            return 1;
        }
        // modify the current network
        pNtkRes = Abc_NtkDarClockGate( pNtk, pNtkCare, pPars );
        Abc_NtkDelete( pNtkCare );
    }
    else if ( argc == globalUtilOptind )
    {
        pNtkRes = Abc_NtkDarClockGate( pNtk, NULL, pPars );
    }
    else
    {
        Abc_Print( -1, "Wrong number of arguments.\n" );
        return 0;
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Clock gating has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: clockgate [-LNDCVK <num>] [-avwh] <file>\n" );
    Abc_Print( -2, "\t         sequential clock gating with observability don't-cares\n" );
    Abc_Print( -2, "\t-L num : max level number of a clock gate [default = %d]\n", pPars->nLevelMax );
    Abc_Print( -2, "\t-N num : max number of candidates for a flop [default = %d]\n", pPars->nCandMax );
    Abc_Print( -2, "\t-D num : max number of ODC levels to consider [default = %d]\n", pPars->nOdcMax );
    Abc_Print( -2, "\t-C num : max number of conflicts at a node [default = %d]\n", pPars->nConfMax );
    Abc_Print( -2, "\t-V num : min number of vars to recycle SAT solver [default = %d]\n", pPars->nVarsMin );
    Abc_Print( -2, "\t-K num : min number of flops to recycle SAT solver [default = %d]\n", pPars->nFlopsMin );
    Abc_Print( -2, "\t-a     : toggle minimizing area-only [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle even more detailed output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile   : (optional) constraints for primary inputs and register outputs\n");
    return 1;
}